

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<double> __thiscall Omega_h::array_cast<double,int>(Omega_h *this,Read<int> *in)

{
  void *extraout_RDX;
  Read<double> RVar1;
  Write<double> local_d0;
  undefined1 local_c0 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<double> out;
  Read<int> *in_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(in->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((in->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(in->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr = in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<double>::Write((Write<double> *)local_68,(LO)(local_10 >> 2),(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<double>::Write((Write<double> *)local_c0,(Write<double> *)local_68);
  Read<int>::Read((Read<int> *)&f.out.shared_alloc_.direct_ptr,in);
  if (((ulong)(in->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((in->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(in->write_).shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::array_cast<double,int>(Omega_h::Read<int>)::_lambda(int)_1_>
            ((LO)(local_20 >> 2),(type *)local_c0,"array_cast");
  Write<double>::Write(&local_d0,(Write<signed_char> *)local_68);
  Read<double>::Read((Read<double> *)this,&local_d0);
  Write<double>::~Write(&local_d0);
  array_cast<double,int>(Omega_h::Read<int>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_c0);
  Write<double>::~Write((Write<double> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<Tout> array_cast(Read<Tin> in) {
  auto out = Write<Tout>(in.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = static_cast<Tout>(in[i]); };
  parallel_for(in.size(), f, "array_cast");
  return out;
}